

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramLimitCase::iterate
          (GeometryProgramLimitCase *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  TestLog *pTVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  int *piVar6;
  MessageBuilder *pMVar7;
  ShaderProgram *pSVar8;
  RenderContext *pRVar9;
  ProgramSources *pPVar10;
  Enum<int,_2UL> EVar11;
  MessageBuilder local_940;
  allocator<char> local_7b9;
  string local_7b8;
  MessageBuilder local_798;
  DefaultDeleter<glu::ShaderProgram> local_616;
  undefined1 local_615;
  ContextType local_614;
  string local_610;
  ShaderSource local_5f0;
  ContextType local_5c8;
  allocator<char> local_5c1;
  string local_5c0;
  string local_5a0;
  ShaderSource local_580;
  ContextType local_558;
  allocator<char> local_551;
  string local_550;
  string local_530;
  ShaderSource local_510;
  ProgramSources local_4e8;
  undefined1 local_418 [8];
  UniquePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> program;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  string geometrySource;
  string local_360;
  allocator<char> local_339;
  string local_338;
  ScopedLogSection local_318;
  ScopedLogSection section;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  uint local_26c;
  GetNameFunc local_268;
  int local_260;
  Enum<int,_2UL> local_258;
  MessageBuilder local_248;
  undefined1 local_c8 [8];
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> state;
  int limit;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  ResultCollector result;
  GeometryProgramLimitCase *this_local;
  
  result.m_message.field_2._8_8_ = this;
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88," // ERROR: ",&local_89);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_68,pTVar4,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)&gl.field_0x14);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_c8,(Functions *)CONCAT44(extraout_var,iVar2),pTVar4);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_c8,true);
  GVar3 = this->m_apiName;
  piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)&gl.field_0x14);
  glu::CallLogWrapper::glGetIntegerv((CallLogWrapper *)local_c8,GVar3,piVar6);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_c8);
  glu::checkError(GVar3,"getIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x11be);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_248,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  EVar11 = glu::getGettableStateStr(this->m_apiName);
  local_268 = EVar11.m_getName;
  local_260 = EVar11.m_value;
  local_258.m_getName = local_268;
  local_258.m_value = local_260;
  pMVar7 = tcu::MessageBuilder::operator<<(&local_248,&local_258);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x2be9a12);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(StateQueryMemoryWriteGuard<int> *)&gl.field_0x14)
  ;
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_248);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)&gl.field_0x14,(ResultCollector *)local_68);
  if (bVar1) {
    piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)&gl.field_0x14);
    if (*piVar6 < this->m_limit) {
      de::toString<int>(&local_2f0,&this->m_limit);
      std::operator+(&local_2d0,"Minimum value = ",&local_2f0);
      std::operator+(&local_2b0,&local_2d0,", got ");
      piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::get
                         ((StateQueryMemoryWriteGuard<int> *)&gl.field_0x14);
      de::toString<int>((string *)&section,piVar6);
      std::operator+(&local_290,&local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
      tcu::ResultCollector::fail((ResultCollector *)local_68,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_68,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      this_local._4_4_ = STOP;
      local_26c = 1;
    }
    else {
      piVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)&gl.field_0x14);
      state.m_value = *piVar6;
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"Types",&local_339);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"Alternative queries",
                 (allocator<char> *)(geometrySource.field_2._M_local_buf + 0xf));
      tcu::ScopedLogSection::ScopedLogSection(&local_318,pTVar4,&local_338,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator
                ((allocator<char> *)(geometrySource.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator(&local_339);
      deqp::gls::StateQueryUtil::verifyStateInteger
                ((ResultCollector *)local_68,(CallLogWrapper *)local_c8,this->m_apiName,
                 state.m_value,QUERY_BOOLEAN);
      deqp::gls::StateQueryUtil::verifyStateInteger
                ((ResultCollector *)local_68,(CallLogWrapper *)local_c8,this->m_apiName,
                 state.m_value,QUERY_INTEGER64);
      deqp::gls::StateQueryUtil::verifyStateInteger
                ((ResultCollector *)local_68,(CallLogWrapper *)local_c8,this->m_apiName,
                 state.m_value,QUERY_FLOAT);
      tcu::ScopedLogSection::~ScopedLogSection(&local_318);
      local_26c = 0;
    }
  }
  else {
    tcu::ResultCollector::setTestContextResult
              ((ResultCollector *)local_68,
               (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    this_local._4_4_ = STOP;
    local_26c = 1;
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_c8);
  if (local_26c == 0) {
    std::operator+(&local_3e8,
                   "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points) in;\nlayout(points, max_vertices = 1) out;\nvoid main ()\n{\n\t// Building the shader will fail if the constant value is not the expected\n\tconst mediump int cArraySize = (gl_"
                   ,&this->m_glslName);
    std::operator+(&local_3c8,&local_3e8," == ");
    de::toString<int>((string *)
                      &program.
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.field_0x8,&state.m_value);
    std::operator+(&local_3a8,&local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &program.
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                    m_data.field_0x8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                   &local_3a8,
                   ") ? (1) : (-1);\n\tfloat[cArraySize] fArray;\n\tfArray[0] = 0.0f;\n\tgl_Position = vec4(0.0, 0.0, 0.0, fArray[0]);\n\tEmitVertex();\n}\n"
                  );
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string
              ((string *)
               &program.
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data
                .field_0x8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    pSVar8 = (ShaderProgram *)operator_new(0xd0);
    local_615 = 1;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_4e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_550,
               "${GLSL_VERSION_DECL}\nvoid main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
               ,&local_551);
    pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    local_558.super_ApiType.m_bits = (ApiType)(*pRVar9->_vptr_RenderContext[2])();
    specializeShader(&local_530,&local_550,&local_558);
    glu::VertexSource::VertexSource((VertexSource *)&local_510,&local_530);
    pPVar10 = glu::ProgramSources::operator<<(&local_4e8,&local_510);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c0,
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
               ,&local_5c1);
    pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    local_5c8.super_ApiType.m_bits = (ApiType)(*pRVar9->_vptr_RenderContext[2])();
    specializeShader(&local_5a0,&local_5c0,&local_5c8);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_580,&local_5a0);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_580);
    pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    local_614.super_ApiType.m_bits = (ApiType)(*pRVar9->_vptr_RenderContext[2])();
    specializeShader(&local_610,(string *)local_388,&local_614);
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_5f0,&local_610);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_5f0);
    glu::ShaderProgram::ShaderProgram(pSVar8,pRVar5,pPVar10);
    local_615 = 0;
    de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_616);
    de::details::UniquePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::UniquePtr
              ((UniquePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)local_418,
               pSVar8);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_610);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    glu::VertexSource::~VertexSource((VertexSource *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    std::allocator<char>::~allocator(&local_551);
    glu::ProgramSources::~ProgramSources(&local_4e8);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_798,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_798,(char (*) [48])"Building a test shader to verify GLSL constant ")
    ;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_glslName);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [8])0x2ad66f6);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_798);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
             operator*((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                       local_418);
    glu::operator<<(pTVar4,pSVar8);
    pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
             operator->((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                        local_418);
    bVar1 = glu::ShaderProgram::isOk(pSVar8);
    if (bVar1) {
      pTVar4 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_940,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_940,(char (*) [9])"Build ok");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_940);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b8,"Shader build failed",&local_7b9);
      tcu::ResultCollector::fail((ResultCollector *)local_68,&local_7b8);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::allocator<char>::~allocator(&local_7b9);
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_68,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      this_local._4_4_ = STOP;
    }
    local_26c = (uint)!bVar1;
    de::details::UniquePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniquePtr
              ((UniquePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)local_418);
    std::__cxx11::string::~string((string *)local_388);
    if (local_26c == 0) {
      tcu::ResultCollector::setTestContextResult
                ((ResultCollector *)local_68,
                 (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      this_local._4_4_ = STOP;
      local_26c = 1;
    }
  }
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_68);
  return this_local._4_4_;
}

Assistant:

GeometryProgramLimitCase::IterateResult GeometryProgramLimitCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	int						limit;

	// query limit
	{
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>	state;
		glu::CallLogWrapper											gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

		gl.enableLogging(true);
		gl.glGetIntegerv(m_apiName, &state);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getIntegerv()");

		m_testCtx.getLog() << tcu::TestLog::Message << glu::getGettableStateStr(m_apiName) << " = " << state << tcu::TestLog::EndMessage;

		if (!state.verifyValidity(result))
		{
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		if (state < m_limit)
		{
			result.fail("Minimum value = " + de::toString(m_limit) + ", got " + de::toString(state.get()));
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		limit = state;

		// verify other getters
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_BOOLEAN);
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_INTEGER64);
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_FLOAT);
		}
	}

	// verify limit is the same in GLSL
	{
		static const char* const vertexSource =		"${GLSL_VERSION_DECL}\n"
													"void main ()\n"
													"{\n"
													"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
													"}\n";
		static const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"layout(location = 0) out mediump vec4 fragColor;\n"
													"void main ()\n"
													"{\n"
													"	fragColor = vec4(0.0, 0.0, 0.0, 0.0);\n"
													"}\n";
		const std::string geometrySource =			"${GLSL_VERSION_DECL}\n"
													"${GLSL_EXT_GEOMETRY_SHADER}"
													"layout(points) in;\n"
													"layout(points, max_vertices = 1) out;\n"
													"void main ()\n"
													"{\n"
													"	// Building the shader will fail if the constant value is not the expected\n"
													"	const mediump int cArraySize = (gl_" + m_glslName + " == " + de::toString(limit) + ") ? (1) : (-1);\n"
													"	float[cArraySize] fArray;\n"
													"	fArray[0] = 0.0f;\n"
													"	gl_Position = vec4(0.0, 0.0, 0.0, fArray[0]);\n"
													"	EmitVertex();\n"
													"}\n";

		const de::UniquePtr<glu::ShaderProgram> program(new glu::ShaderProgram(m_context.getRenderContext(),
																			   glu::ProgramSources()
																			   << glu::VertexSource(specializeShader(vertexSource, m_context.getRenderContext().getType()))
																			   << glu::FragmentSource(specializeShader(fragmentSource, m_context.getRenderContext().getType()))
																			   << glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType()))));

		m_testCtx.getLog() << tcu::TestLog::Message << "Building a test shader to verify GLSL constant " << m_glslName << " value." << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << *program;

		if (!program->isOk())
		{
			// compile failed, assume static assert failed
			result.fail("Shader build failed");
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Build ok" << tcu::TestLog::EndMessage;
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}